

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O1

doublereal sdot_(integer *n,real *sx,integer *incx,real *sy,integer *incy)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float *pfVar5;
  float *pfVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  
  uVar1 = *n;
  if ((int)uVar1 < 1) {
    return 0.0;
  }
  iVar2 = *incx;
  if (((long)iVar2 == 1) && (*incy == 1)) {
    if (uVar1 % 5 == 0) {
      fVar11 = 0.0;
      fVar4 = 0.0;
      if ((int)uVar1 < 1) goto LAB_00114f2a;
    }
    else {
      fVar11 = 0.0;
      uVar9 = 0;
      do {
        fVar11 = fVar11 + sx[uVar9] * sy[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar1 % 5 != uVar9);
      fVar4 = fVar11;
      if ((int)uVar1 < 5) goto LAB_00114f2a;
    }
    fVar11 = fVar4;
    uVar7 = uVar1 % 5 + 1;
    lVar8 = 0;
    do {
      fVar11 = sx[(ulong)uVar7 + lVar8 + 3] * sy[(ulong)uVar7 + lVar8 + 3] +
               sx[(ulong)uVar7 + lVar8 + 2] * sy[(ulong)uVar7 + lVar8 + 2] +
               sx[(ulong)uVar7 + lVar8 + 1] * sy[(ulong)uVar7 + lVar8 + 1] +
               sx[(ulong)uVar7 + lVar8] * sy[(ulong)uVar7 + lVar8] +
               sx[(ulong)uVar7 + lVar8 + -1] * sy[(ulong)uVar7 + lVar8 + -1] + fVar11;
      lVar8 = lVar8 + 5;
    } while ((int)(uVar7 + (int)lVar8) <= (int)uVar1);
  }
  else {
    lVar8 = (long)(int)(iVar2 * (1 - uVar1) + 1);
    if (-1 < iVar2) {
      lVar8 = 1;
    }
    iVar3 = *incy;
    lVar10 = (long)(int)((1 - uVar1) * iVar3 + 1);
    if (-1 < (long)iVar3) {
      lVar10 = 1;
    }
    uVar7 = 1;
    if (1 < (int)uVar1) {
      uVar7 = uVar1;
    }
    pfVar5 = sy + lVar10 + -1;
    pfVar6 = sx + lVar8 + -1;
    fVar11 = 0.0;
    do {
      fVar11 = fVar11 + *pfVar6 * *pfVar5;
      pfVar5 = pfVar5 + iVar3;
      pfVar6 = pfVar6 + iVar2;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
LAB_00114f2a:
  return (double)fVar11;
}

Assistant:

doublereal sdot_(integer *n, real *sx, integer *incx, real *sy, integer *incy)
{
    /* System generated locals */
    integer i__1;
    real ret_val;

    /* Local variables */
    static integer i__, m, ix, iy, mp1;
    static real stemp;


/*
       forms the dot product of two vectors.
       uses unrolled loops for increments equal to one.
       jack dongarra, linpack, 3/11/78.
       modified 12/3/93, array(1) declarations changed to array(*)
*/


    /* Parameter adjustments */
    --sy;
    --sx;

    /* Function Body */
    stemp = 0.f;
    ret_val = 0.f;
    if (*n <= 0) {
	return ret_val;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*
          code for unequal increments or equal increments
            not equal to 1
*/

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	stemp += sx[ix] * sy[iy];
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    ret_val = stemp;
    return ret_val;

/*
          code for both increments equal to 1


          clean-up loop
*/

L20:
    m = *n % 5;
    if (m == 0) {
	goto L40;
    }
    i__1 = m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	stemp += sx[i__] * sy[i__];
/* L30: */
    }
    if (*n < 5) {
	goto L60;
    }
L40:
    mp1 = m + 1;
    i__1 = *n;
    for (i__ = mp1; i__ <= i__1; i__ += 5) {
	stemp = stemp + sx[i__] * sy[i__] + sx[i__ + 1] * sy[i__ + 1] + sx[
		i__ + 2] * sy[i__ + 2] + sx[i__ + 3] * sy[i__ + 3] + sx[i__ +
		4] * sy[i__ + 4];
/* L50: */
    }
L60:
    ret_val = stemp;
    return ret_val;
}